

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestBranchInternal::Run(TestBranchInternal *this)

{
  Outputter *pOVar1;
  stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
  *psVar2;
  _Elt_pointer ppBVar3;
  Cons<std::pair<testinator::Nil,_const_char_*>_> *in_RDX;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  *t;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  *t_00;
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:404:5)>
  rspop404;
  BranchScope rs404;
  BranchScope rs399;
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:399:5)>
  rspop399;
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:404:5)>
  local_81;
  undefined1 local_80 [24];
  string local_68;
  BranchScope local_48;
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:399:5)>
  local_30 [8];
  char *local_28;
  string *local_20;
  
  pOVar1 = (this->super_Test).m_op;
  local_48.m_child = (Branch *)0x160708;
  testinator::Diagnostic<testinator::Cons<std::pair<testinator::Nil,char_const*>>>
            (&local_68,(testinator *)&local_48,in_RDX);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  testinator::BranchScope::BranchScope
            (&local_48,399,
             "/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp"
             ,"A");
  if (local_48.m_canRun == true) {
    pOVar1 = (this->super_Test).m_op;
    psVar2 = testinator::Branch::getStack();
    ppBVar3 = (psVar2->c).
              super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppBVar3 ==
        (psVar2->c).super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppBVar3 = (psVar2->c).
                super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_80._16_8_ = &ppBVar3[-1]->m_name;
    local_80._8_8_ = "branch ";
    testinator::
    Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,std::__cxx11::string_const&>>>
              (&local_68,(testinator *)local_80,t);
    (*pOVar1->_vptr_Outputter[3])(pOVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    testinator::
    AtScopeExit<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:399:5)>
    ::~AtScopeExit(local_30);
  }
  testinator::BranchScope::BranchScope
            ((BranchScope *)local_80,0x194,
             "/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp"
             ,"B");
  if (local_80[0x10] == true) {
    pOVar1 = (this->super_Test).m_op;
    psVar2 = testinator::Branch::getStack();
    ppBVar3 = (psVar2->c).
              super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppBVar3 ==
        (psVar2->c).super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppBVar3 = (psVar2->c).
                super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_20 = &ppBVar3[-1]->m_name;
    local_28 = "branch ";
    testinator::
    Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,std::__cxx11::string_const&>>>
              (&local_68,(testinator *)local_30,t_00);
    (*pOVar1->_vptr_Outputter[3])(pOVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    testinator::
    AtScopeExit<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:404:5)>
    ::~AtScopeExit(&local_81);
  }
  *(bool *)local_80._0_8_ = (bool)(*(bool *)local_80._0_8_ & *(bool *)local_80._8_8_);
  *(bool *)(local_80._0_8_ + 1) = true;
  (local_48.m_parent)->m_complete =
       (bool)((local_48.m_parent)->m_complete & (local_48.m_child)->m_complete);
  (local_48.m_parent)->m_canRunChild = true;
  return true;
}

Assistant:

virtual bool Run()
  {
    DIAGNOSTIC("no branch");

    BRANCH(A)
    {
      DIAGNOSTIC("branch " << BRANCH_NAME);
    }

    BRANCH(B)
    {
      DIAGNOSTIC("branch " << BRANCH_NAME);
    }

    return true;
  }